

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_padding.c
# Opt level: O2

void ihevc_pad_horz_chroma(UWORD8 *pu1_src,WORD32 src_strd,WORD32 ht,WORD32 wd,WORD32 pad_size)

{
  UWORD32 num_words;
  WORD32 WVar1;
  bool bVar2;
  
  num_words = pad_size >> 1;
  WVar1 = 0;
  if (0 < ht) {
    WVar1 = ht;
  }
  while (bVar2 = WVar1 != 0, WVar1 = WVar1 + -1, bVar2) {
    ihevc_memset_16bit((UWORD16 *)((long)pu1_src + -(long)(int)num_words * 2),*(UWORD16 *)pu1_src,
                       num_words);
    ihevc_memset_16bit((UWORD16 *)((long)pu1_src + (long)(wd >> 1) * 2),
                       *(UWORD16 *)((long)pu1_src + ((long)(wd >> 1) + -1) * 2),num_words);
    pu1_src = (UWORD8 *)((long)pu1_src + (long)(src_strd >> 1) * 2);
  }
  return;
}

Assistant:

void ihevc_pad_horz_chroma(UWORD8 *pu1_src,
                           WORD32 src_strd,
                           WORD32 ht,
                           WORD32 wd,
                           WORD32 pad_size)
{
    WORD32 row;
    //WORD32 col;
    UWORD16 *pu2_src = (UWORD16 *)pu1_src;

    src_strd >>= 1;
    wd >>= 1;
    pad_size >>= 1;

    for(row = 0; row < ht; row++)
    {
        UWORD16 u2_uv_val;

        u2_uv_val = pu2_src[0];
        ihevc_memset_16bit(&pu2_src[-pad_size], u2_uv_val, pad_size);

        u2_uv_val = pu2_src[wd - 1];
        ihevc_memset_16bit(&pu2_src[wd], u2_uv_val, pad_size);

        pu2_src += src_strd;
    }
}